

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

bool __thiscall gjkepa2_impl::GJK::EncloseOrigin(GJK *this)

{
  sSimplex *psVar1;
  sSV *psVar2;
  bool bVar3;
  uint uVar4;
  U i_1;
  long lVar5;
  U i;
  cbtScalar cVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  cbtVector3 cVar30;
  cbtVector3 n;
  cbtVector3 p;
  cbtVector3 local_78;
  cbtVector3 local_68;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar18 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [56];
  
  auVar29 = in_ZMM1._8_56_;
  auVar18 = in_ZMM0._8_56_;
  psVar1 = this->m_simplex;
  switch(psVar1->rank) {
  case 1:
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      local_78.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_78.m_floats[lVar5] = 1.0;
      appendvertice(this,this->m_simplex,&local_78);
      bVar3 = EncloseOrigin(this);
      if (bVar3) {
        return true;
      }
      psVar1 = this->m_simplex;
      uVar4 = psVar1->rank - 1;
      psVar1->rank = uVar4;
      psVar2 = psVar1->c[uVar4];
      uVar4 = this->m_nfree;
      this->m_nfree = uVar4 + 1;
      this->m_free[uVar4] = psVar2;
      auVar7._0_8_ = local_78.m_floats._0_8_ ^ 0x8000000080000000;
      auVar7._8_4_ = 0x80000000;
      auVar7._12_4_ = 0x80000000;
      auVar19._0_4_ = -local_78.m_floats[2];
      auVar19._4_4_ = 0x80000000;
      auVar19._8_4_ = 0x80000000;
      auVar19._12_4_ = 0x80000000;
      local_68.m_floats = (cbtScalar  [4])vinsertps_avx(auVar7,auVar19,0x28);
      appendvertice(this,this->m_simplex,&local_68);
      bVar3 = EncloseOrigin(this);
      if (bVar3) {
        return true;
      }
      psVar1 = this->m_simplex;
      uVar4 = psVar1->rank - 1;
      psVar1->rank = uVar4;
      psVar2 = psVar1->c[uVar4];
      uVar4 = this->m_nfree;
      this->m_nfree = uVar4 + 1;
      this->m_free[uVar4] = psVar2;
    }
    break;
  case 2:
    cVar30 = ::operator-(&psVar1->c[1]->w,&psVar1->c[0]->w);
    auVar28._0_8_ = cVar30.m_floats._8_8_;
    auVar28._8_56_ = auVar29;
    auVar16._0_8_ = cVar30.m_floats._0_8_;
    auVar16._8_56_ = auVar18;
    local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar28._0_16_);
    for (lVar5 = 0; auVar18 = auVar28._8_56_, lVar5 != 3; lVar5 = lVar5 + 1) {
      auVar29 = ZEXT856(0);
      local_68.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_68.m_floats[lVar5] = 1.0;
      cVar30 = cbtVector3::cross(&local_78,&local_68);
      auVar28._0_8_ = cVar30.m_floats._8_8_;
      auVar28._8_56_ = auVar18;
      auVar17._0_8_ = cVar30.m_floats._0_8_;
      auVar17._8_56_ = auVar29;
      local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar28._0_16_);
      cVar6 = cbtVector3::length2(&local_50);
      if (0.0 < cVar6) {
        appendvertice(this,this->m_simplex,&local_50);
        bVar3 = EncloseOrigin(this);
        if (bVar3) {
          return true;
        }
        psVar1 = this->m_simplex;
        uVar4 = psVar1->rank - 1;
        psVar1->rank = uVar4;
        psVar2 = psVar1->c[uVar4];
        uVar4 = this->m_nfree;
        this->m_nfree = uVar4 + 1;
        this->m_free[uVar4] = psVar2;
        auVar9._0_8_ = local_50.m_floats._0_8_ ^ 0x8000000080000000;
        auVar9._8_4_ = 0x80000000;
        auVar9._12_4_ = 0x80000000;
        auVar21._0_4_ = -local_50.m_floats[2];
        auVar21._4_4_ = 0x80000000;
        auVar21._8_4_ = 0x80000000;
        auVar21._12_4_ = 0x80000000;
        auVar28 = ZEXT1664(auVar21);
        local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar9,auVar21,0x28);
        appendvertice(this,this->m_simplex,&local_40);
        bVar3 = EncloseOrigin(this);
        if (bVar3) {
          return true;
        }
        psVar1 = this->m_simplex;
        uVar4 = psVar1->rank - 1;
        psVar1->rank = uVar4;
        psVar2 = psVar1->c[uVar4];
        uVar4 = this->m_nfree;
        this->m_nfree = uVar4 + 1;
        this->m_free[uVar4] = psVar2;
      }
    }
    break;
  case 3:
    cVar30 = ::operator-(&psVar1->c[1]->w,&psVar1->c[0]->w);
    auVar22._0_8_ = cVar30.m_floats._8_8_;
    auVar22._8_56_ = auVar29;
    auVar10._0_8_ = cVar30.m_floats._0_8_;
    auVar10._8_56_ = auVar18;
    local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar22._0_16_);
    auVar18 = ZEXT856(local_68.m_floats._8_8_);
    cVar30 = ::operator-(&this->m_simplex->c[2]->w,&this->m_simplex->c[0]->w);
    auVar23._0_8_ = cVar30.m_floats._8_8_;
    auVar23._8_56_ = auVar29;
    auVar11._0_8_ = cVar30.m_floats._0_8_;
    auVar11._8_56_ = auVar18;
    local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar11._0_16_,auVar23._0_16_);
    auVar18 = ZEXT856(local_50.m_floats._8_8_);
    cVar30 = cbtVector3::cross(&local_68,&local_50);
    auVar24._0_8_ = cVar30.m_floats._8_8_;
    auVar24._8_56_ = auVar29;
    auVar12._0_8_ = cVar30.m_floats._0_8_;
    auVar12._8_56_ = auVar18;
    local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12._0_16_,auVar24._0_16_);
    cVar6 = cbtVector3::length2(&local_78);
    if (0.0 < cVar6) {
      appendvertice(this,this->m_simplex,&local_78);
      bVar3 = EncloseOrigin(this);
      if (!bVar3) {
        psVar1 = this->m_simplex;
        uVar4 = psVar1->rank - 1;
        psVar1->rank = uVar4;
        psVar2 = psVar1->c[uVar4];
        uVar4 = this->m_nfree;
        this->m_nfree = uVar4 + 1;
        this->m_free[uVar4] = psVar2;
        auVar8._0_8_ = local_78.m_floats._0_8_ ^ 0x8000000080000000;
        auVar8._8_4_ = 0x80000000;
        auVar8._12_4_ = 0x80000000;
        auVar20._0_4_ = -local_78.m_floats[2];
        auVar20._4_4_ = 0x80000000;
        auVar20._8_4_ = 0x80000000;
        auVar20._12_4_ = 0x80000000;
        local_68.m_floats = (cbtScalar  [4])vinsertps_avx(auVar8,auVar20,0x28);
        appendvertice(this,this->m_simplex,&local_68);
        bVar3 = EncloseOrigin(this);
        if (!bVar3) {
          psVar1 = this->m_simplex;
          uVar4 = psVar1->rank - 1;
          psVar1->rank = uVar4;
          psVar2 = psVar1->c[uVar4];
          uVar4 = this->m_nfree;
          this->m_nfree = uVar4 + 1;
          this->m_free[uVar4] = psVar2;
          return false;
        }
      }
      return true;
    }
    break;
  case 4:
    cVar30 = ::operator-(&psVar1->c[0]->w,&psVar1->c[3]->w);
    auVar25._0_8_ = cVar30.m_floats._8_8_;
    auVar25._8_56_ = auVar29;
    auVar13._0_8_ = cVar30.m_floats._0_8_;
    auVar13._8_56_ = auVar18;
    local_78.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar25._0_16_);
    auVar18 = ZEXT856(local_78.m_floats._8_8_);
    cVar30 = ::operator-(&this->m_simplex->c[1]->w,&this->m_simplex->c[3]->w);
    auVar26._0_8_ = cVar30.m_floats._8_8_;
    auVar26._8_56_ = auVar29;
    auVar14._0_8_ = cVar30.m_floats._0_8_;
    auVar14._8_56_ = auVar18;
    local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,auVar26._0_16_);
    auVar18 = ZEXT856(local_68.m_floats._8_8_);
    cVar30 = ::operator-(&this->m_simplex->c[2]->w,&this->m_simplex->c[3]->w);
    auVar27._0_8_ = cVar30.m_floats._8_8_;
    auVar27._8_56_ = auVar29;
    auVar15._0_8_ = cVar30.m_floats._0_8_;
    auVar15._8_56_ = auVar18;
    local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar15._0_16_,auVar27._0_16_);
    cVar6 = det(&local_78,&local_68,&local_50);
    if (cVar6 != 0.0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EncloseOrigin()
	{
		switch (m_simplex->rank)
		{
			case 1:
			{
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					appendvertice(*m_simplex, axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 2:
			{
				const cbtVector3 d = m_simplex->c[1]->w - m_simplex->c[0]->w;
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					const cbtVector3 p = cbtCross(d, axis);
					if (p.length2() > 0)
					{
						appendvertice(*m_simplex, p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
						appendvertice(*m_simplex, -p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
					}
				}
			}
			break;
			case 3:
			{
				const cbtVector3 n = cbtCross(m_simplex->c[1]->w - m_simplex->c[0]->w,
											m_simplex->c[2]->w - m_simplex->c[0]->w);
				if (n.length2() > 0)
				{
					appendvertice(*m_simplex, n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 4:
			{
				if (cbtFabs(det(m_simplex->c[0]->w - m_simplex->c[3]->w,
							   m_simplex->c[1]->w - m_simplex->c[3]->w,
							   m_simplex->c[2]->w - m_simplex->c[3]->w)) > 0)
					return (true);
			}
			break;
		}
		return (false);
	}